

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

string * __thiscall
Omega_h::get_full_name_abi_cxx11_(string *__return_storage_ptr__,Omega_h *this,Input *input)

{
  Input *input_00;
  bool bVar1;
  LO __val;
  InputList *this_00;
  InputMap *this_01;
  string sStack_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  input_00 = *(Input **)(this + 8);
  if (input_00 != (Input *)0x0) {
    get_full_name_abi_cxx11_(&sStack_48,(Omega_h *)input_00,input);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    bVar1 = is_type<Omega_h::InputList>(input_00);
    if (bVar1) {
      this_00 = as_type<Omega_h::InputList>(input_00);
      __val = InputList::position(this_00,(Input *)this);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::to_string(&sStack_48,__val);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_48);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      bVar1 = is_type<Omega_h::InputMap>(input_00);
      if (bVar1) {
        this_01 = as_type<Omega_h::InputMap>(input_00);
        InputMap::name_abi_cxx11_(this_01,(Input *)this);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_full_name(Input const& input) {
  std::string full_name;
  if (input.parent != nullptr) {
    auto& parent = *(input.parent);
    full_name = get_full_name(parent);
    if (is_type<InputList>(parent)) {
      auto i = as_type<InputList>(parent).position(input);
      full_name += "[";
      full_name += std::to_string(i);
      full_name += "]";
    } else if (is_type<InputMap>(parent)) {
      auto& name = as_type<InputMap>(parent).name(input);
      full_name += ".";
      full_name += name;
    }
  }
  return full_name;
}